

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderCompiler.cpp
# Opt level: O2

bool trim(string *s)

{
  _Iter_pred<trim(std::__cxx11::string&)::__0> *p_Var1;
  pointer pcVar2;
  bool bVar3;
  char *pcVar4;
  long lVar5;
  pointer pcVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __it;
  _Iter_pred<trim(std::__cxx11::string&)::__0> *__it_00;
  _Iter_pred<trim(std::__cxx11::string&)::__0> *p_Var7;
  pointer pcVar8;
  size_type sVar9;
  _Iter_pred<trim(std::__cxx11::string&)::__0> *this;
  pointer local_68;
  pointer local_60;
  pointer local_58;
  pointer local_50;
  pointer local_48;
  pointer local_40;
  pointer local_38;
  
  __it._M_current = (char *)0x23;
  pcVar4 = (char *)std::__cxx11::string::find((char)s,0x23);
  if (pcVar4 != (char *)0xffffffffffffffff) {
    std::__cxx11::string::erase((ulong)s,(ulong)pcVar4);
    __it._M_current = pcVar4;
  }
  __it_00 = (_Iter_pred<trim(std::__cxx11::string&)::__0> *)(s->_M_dataplus)._M_p;
  sVar9 = s->_M_string_length;
  p_Var1 = __it_00 + sVar9;
  this = __it_00;
  for (lVar5 = (long)sVar9 >> 2; p_Var7 = this, 0 < lVar5; lVar5 = lVar5 + -1) {
    bVar3 = __gnu_cxx::__ops::_Iter_pred<trim(std::__cxx11::string&)::$_0>::operator()(this,__it);
    if (bVar3) goto LAB_001095ea;
    bVar3 = __gnu_cxx::__ops::_Iter_pred<trim(std::__cxx11::string&)::$_0>::operator()
                      (this + 1,__it);
    p_Var7 = this + 1;
    if (bVar3) goto LAB_001095ea;
    bVar3 = __gnu_cxx::__ops::_Iter_pred<trim(std::__cxx11::string&)::$_0>::operator()
                      (this + 2,__it);
    p_Var7 = this + 2;
    if (bVar3) goto LAB_001095ea;
    bVar3 = __gnu_cxx::__ops::_Iter_pred<trim(std::__cxx11::string&)::$_0>::operator()
                      (this + 3,__it);
    p_Var7 = this + 3;
    if (bVar3) goto LAB_001095ea;
    this = this + 4;
    sVar9 = sVar9 - 4;
  }
  if (sVar9 == 1) {
LAB_0010971c:
    bVar3 = __gnu_cxx::__ops::_Iter_pred<trim(std::__cxx11::string&)::$_0>::operator()(this,__it);
    p_Var7 = p_Var1;
    if (bVar3) {
      p_Var7 = this;
    }
  }
  else if (sVar9 == 2) {
LAB_001095c3:
    bVar3 = __gnu_cxx::__ops::_Iter_pred<trim(std::__cxx11::string&)::$_0>::operator()(p_Var7,__it);
    if (!bVar3) {
      this = p_Var7 + 1;
      goto LAB_0010971c;
    }
  }
  else {
    p_Var7 = p_Var1;
    if ((sVar9 == 3) &&
       (bVar3 = __gnu_cxx::__ops::_Iter_pred<trim(std::__cxx11::string&)::$_0>::operator()
                          (this,__it), p_Var7 = this, !bVar3)) {
      p_Var7 = this + 1;
      goto LAB_001095c3;
    }
  }
LAB_001095ea:
  std::__cxx11::string::erase(s,__it_00,p_Var7);
  pcVar2 = (s->_M_dataplus)._M_p;
  sVar9 = s->_M_string_length;
  for (lVar5 = (long)sVar9 >> 2; pcVar8 = pcVar2 + sVar9, pcVar6 = pcVar8, 0 < lVar5;
      lVar5 = lVar5 + -1) {
    local_50 = pcVar8;
    bVar3 = __gnu_cxx::__ops::_Iter_pred<trim(std::__cxx11::string&)::$_1>::operator()
                      ((_Iter_pred<trim(std::__cxx11::string&)::__1> *)&local_50,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it_00);
    if (bVar3) goto LAB_001096eb;
    local_58 = pcVar2 + (sVar9 - 1);
    bVar3 = __gnu_cxx::__ops::_Iter_pred<trim(std::__cxx11::string&)::$_1>::operator()
                      ((_Iter_pred<trim(std::__cxx11::string&)::__1> *)&local_58,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it_00);
    pcVar6 = pcVar2 + (sVar9 - 1);
    if (bVar3) goto LAB_001096eb;
    local_60 = pcVar2 + (sVar9 - 2);
    bVar3 = __gnu_cxx::__ops::_Iter_pred<trim(std::__cxx11::string&)::$_1>::operator()
                      ((_Iter_pred<trim(std::__cxx11::string&)::__1> *)&local_60,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it_00);
    pcVar6 = pcVar2 + (sVar9 - 2);
    if (bVar3) goto LAB_001096eb;
    local_68 = pcVar2 + (sVar9 - 3);
    bVar3 = __gnu_cxx::__ops::_Iter_pred<trim(std::__cxx11::string&)::$_1>::operator()
                      ((_Iter_pred<trim(std::__cxx11::string&)::__1> *)&local_68,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it_00);
    pcVar6 = pcVar2 + (sVar9 - 3);
    if (bVar3) goto LAB_001096eb;
    sVar9 = sVar9 - 4;
  }
  if (sVar9 == 3) {
    local_38 = pcVar8;
    bVar3 = __gnu_cxx::__ops::_Iter_pred<trim(std::__cxx11::string&)::$_1>::operator()
                      ((_Iter_pred<trim(std::__cxx11::string&)::__1> *)&local_38,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it_00);
    if (bVar3) goto LAB_001096eb;
    pcVar8 = pcVar2 + 2;
LAB_001096be:
    local_40 = pcVar8;
    bVar3 = __gnu_cxx::__ops::_Iter_pred<trim(std::__cxx11::string&)::$_1>::operator()
                      ((_Iter_pred<trim(std::__cxx11::string&)::__1> *)&local_40,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it_00);
    pcVar6 = pcVar8;
    if (bVar3) goto LAB_001096eb;
    pcVar8 = pcVar8 + -1;
  }
  else {
    if (sVar9 == 2) goto LAB_001096be;
    pcVar6 = pcVar2;
    if (sVar9 != 1) goto LAB_001096eb;
  }
  local_48 = pcVar8;
  bVar3 = __gnu_cxx::__ops::_Iter_pred<trim(std::__cxx11::string&)::$_1>::operator()
                    ((_Iter_pred<trim(std::__cxx11::string&)::__1> *)&local_48,
                     (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)__it_00);
  pcVar6 = pcVar2;
  if (bVar3) {
    pcVar6 = pcVar8;
  }
LAB_001096eb:
  std::__cxx11::string::erase(s,pcVar6,(s->_M_dataplus)._M_p + s->_M_string_length);
  return s->_M_string_length != 0;
}

Assistant:

bool trim(string& s)
{
	size_t pos;
	pos = s.find('#');
	if (pos != string::npos)
		s.erase(pos, s.size() - pos);

	// remove leading whitespace
	s.erase(s.begin(), std::find_if(s.begin(), s.end(), [](int ch) {
		return !_isspace(ch);
	}));

	// remove trailing whitespace
	s.erase(std::find_if(s.rbegin(), s.rend(), [](int ch) {
		return !_isspace(ch);
	}).base(), s.end());

	return !s.empty();
}